

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
ImplicitConcatenation
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *atomCountStack,
          Stack<rapidjson::CrtAllocator> *operatorStack)

{
  Operator *pOVar1;
  char *pcVar2;
  
  pcVar2 = atomCountStack->stackTop_;
  if (3 < (ulong)((long)pcVar2 - (long)atomCountStack->stack_)) {
    if (*(int *)(pcVar2 + -4) != 0) {
      pOVar1 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                         (operatorStack,1);
      *pOVar1 = kConcatenation;
      pcVar2 = atomCountStack->stackTop_;
      if ((ulong)((long)pcVar2 - (long)atomCountStack->stack_) < 4) goto LAB_0013e572;
    }
    *(int *)(pcVar2 + -4) = *(int *)(pcVar2 + -4) + 1;
    return;
  }
LAB_0013e572:
  __assert_fail("GetSize() >= sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x92,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = unsigned int]"
               );
}

Assistant:

Range& GetRange(SizeType index) {
        RAPIDJSON_ASSERT(index < rangeCount_);
        return ranges_.template Bottom<Range>()[index];
    }